

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaTargetGenerator::EnsureParentDirectoryExists(cmNinjaTargetGenerator *this,string *path)

{
  string local_30;
  
  cmsys::SystemTools::GetParentDirectory(&local_30,path);
  EnsureDirectoryExists(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void cmNinjaTargetGenerator::EnsureParentDirectoryExists(
  const std::string& path) const
{
  EnsureDirectoryExists(cmSystemTools::GetParentDirectory(path));
}